

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

void __thiscall FLevelLocals::AddScroller(FLevelLocals *this,int secnum)

{
  uint uVar1;
  TVector2<double> *__s;
  int secnum_local;
  FLevelLocals *this_local;
  
  if ((-1 < secnum) &&
     (uVar1 = TArray<TVector2<double>,_TVector2<double>_>::Size(&this->Scrolls), uVar1 == 0)) {
    TArray<TVector2<double>,_TVector2<double>_>::Resize(&this->Scrolls,numsectors);
    __s = TArray<TVector2<double>,_TVector2<double>_>::operator[](&this->Scrolls,0);
    memset(__s,0,(long)numsectors << 4);
  }
  return;
}

Assistant:

void FLevelLocals::AddScroller (int secnum)
{
	if (secnum < 0)
	{
		return;
	}
	if (Scrolls.Size() == 0)
	{
		Scrolls.Resize(numsectors);
		memset (&Scrolls[0], 0, sizeof(Scrolls[0])*numsectors);
	}
}